

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::IfcLightSourceGoniometric
          (IfcLightSourceGoniometric *this)

{
  IfcLightSourceGoniometric *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xe8,"IfcLightSourceGoniometric");
  IfcLightSource::IfcLightSource(&this->super_IfcLightSource,&PTR_construction_vtable_24__00fb2428);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric,_6UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric,_6UL> *)
             &(this->super_IfcLightSource).field_0x80,&PTR_construction_vtable_24__00fb24a0);
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfb2370;
  *(undefined8 *)&this->field_0xe8 = 0xfb2410;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfb2398;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfb23c0;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x80 = 0xfb23e8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
             &(this->super_IfcLightSource).field_0x90,(LazyObject *)0x0);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcColourRgb>_>::Maybe
            (&this->ColourAppearance);
  std::__cxx11::string::string((string *)&this->LightEmissionSource);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
            (&this->LightDistributionDataSource);
  return;
}

Assistant:

IfcLightSourceGoniometric() : Object("IfcLightSourceGoniometric") {}